

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O3

void tc_ap_str_trim_head_from_set(CuTest *tc)

{
  char *pcVar1;
  char buf_set [1024];
  char buf_str [1024];
  char local_838 [1024];
  undefined8 local_438;
  undefined4 uStack_430;
  undefined1 uStack_42c;
  undefined1 uStack_42b;
  undefined1 uStack_42a;
  undefined1 uStack_429;
  undefined5 uStack_428;
  undefined1 uStack_423;
  undefined1 uStack_422;
  char acStack_421 [1009];
  
  local_838[2] = 0;
  local_838[0] = ' ';
  local_838[1] = '\t';
  pcVar1 = ap_str_trim_head_from_set((char *)0x0,(char *)0x0);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x13,"strings should be equal",(char *)0x0,pcVar1);
  local_438 = local_438 & 0xffffffffffffff00;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x16,"strings should be equal","",pcVar1);
  local_438._0_2_ = 0x20;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x19,"strings should be equal","",pcVar1);
  local_438._2_6_ = local_438._2_6_ & 0xffffffffff00;
  local_438._0_2_ = 0x2020;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x1c,"strings should be equal","",pcVar1);
  local_438._2_6_ = local_438._2_6_ & 0xffffffffff00;
  local_438._0_2_ = 0x2020;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x1f,"strings should be equal","",pcVar1);
  local_438._0_2_ = 9;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x22,"strings should be equal","",pcVar1);
  local_438._2_6_ = local_438._2_6_ & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x909);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x25,"strings should be equal","",pcVar1);
  local_438 = CONCAT44(local_438._4_4_,0x90909);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x28,"strings should be equal","",pcVar1);
  local_438._2_6_ = (uint6)(local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x6120);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x2b,"strings should be equal","a",pcVar1);
  local_438._0_4_ = 0x612020;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x2e,"strings should be equal","a",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438 = CONCAT44(local_438._4_4_,0x61202020);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x31,"strings should be equal","a",pcVar1);
  local_438._2_6_ = (uint6)(local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x6109);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x34,"strings should be equal","a",pcVar1);
  local_438._0_4_ = 0x610909;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x37,"strings should be equal","a",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438._0_4_ = 0x61090909;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x3a,"strings should be equal","a",pcVar1);
  local_438 = CONCAT44(local_438._4_4_,0x206120);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x3d,"strings should be equal","a ",pcVar1);
  local_438._2_6_ = (uint6)(local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x2061);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x40,"strings should be equal","a ",pcVar1);
  local_438._0_4_ = 0x202061;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x43,"strings should be equal","a  ",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438 = CONCAT44(local_438._4_4_,0x20202061);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x46,"strings should be equal","a   ",pcVar1);
  local_438._2_6_ = (uint6)(local_438 >> 0x10) & 0xffffffffff00;
  local_438 = CONCAT62(local_438._2_6_,0x961);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x49,"strings should be equal","a\t",pcVar1);
  local_438._0_4_ = 0x90961;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x4c,"strings should be equal","a\t\t",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438._0_4_ = 0x9090961;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x4f,"strings should be equal","a\t\t\t",pcVar1);
  local_438._0_4_ = 0x96120;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x52,"strings should be equal","a\t",pcVar1);
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  local_438 = CONCAT44(local_438._4_4_,0x9206120);
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x55,"strings should be equal","a \t",pcVar1);
  local_438._0_1_ = ' ';
  local_438._1_1_ = '\t';
  local_438._2_1_ = ' ';
  local_438._3_1_ = '\t';
  local_438._4_1_ = ' ';
  local_438._5_1_ = '\t';
  local_438._6_1_ = 'a';
  local_438._7_1_ = ' ';
  uStack_430 = 0x20092009;
  uStack_42c = 9;
  uStack_42b = 0x20;
  uStack_42a = 9;
  uStack_429 = 0;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x58,"strings should be equal","a \t \t \t \t",pcVar1);
  local_438 = 0x2062626220616161;
  uStack_430 = 0x636363;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x5b,"strings should be equal","aaa bbb ccc",pcVar1);
  uStack_428 = 0x63636320;
  local_438._0_1_ = ' ';
  local_438._1_1_ = ' ';
  local_438._2_1_ = ' ';
  local_438._3_1_ = ' ';
  local_438._4_1_ = ' ';
  local_438._5_1_ = ' ';
  local_438._6_1_ = ' ';
  local_438._7_1_ = ' ';
  uStack_430 = 0x61616120;
  uStack_42c = 0x20;
  uStack_42b = 0x62;
  uStack_42a = 0x62;
  uStack_429 = 0x62;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438,local_838);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x5e,"strings should be equal","aaa bbb ccc",pcVar1);
  uStack_428 = 0x6363632062;
  uStack_423 = 0;
  local_438._0_1_ = ' ';
  local_438._1_1_ = ' ';
  local_438._2_1_ = '\t';
  local_438._3_1_ = '\t';
  local_438._4_1_ = ' ';
  local_438._5_1_ = ' ';
  local_438._6_1_ = '\t';
  local_438._7_1_ = ' ';
  uStack_430 = 0x61610920;
  uStack_42c = 0x61;
  uStack_42b = 0x20;
  uStack_42a = 0x62;
  uStack_429 = 0x62;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,0x61,"strings should be equal","aaa bbb ccc",pcVar1);
  uStack_428 = 0x6363632062;
  uStack_423 = 0x20;
  uStack_422 = 9;
  builtin_strncpy(acStack_421," \t \t   ",8);
  local_438._0_1_ = ' ';
  local_438._1_1_ = ' ';
  local_438._2_1_ = '\t';
  local_438._3_1_ = '\t';
  local_438._4_1_ = ' ';
  local_438._5_1_ = ' ';
  local_438._6_1_ = '\t';
  local_438._7_1_ = ' ';
  uStack_430 = 0x61610920;
  uStack_42c = 0x61;
  uStack_42b = 0x20;
  uStack_42a = 0x62;
  uStack_429 = 0x62;
  pcVar1 = ap_str_trim_head_from_set((char *)&local_438," \t");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
             ,100,"strings should be equal","aaa bbb ccc \t \t \t   ",pcVar1);
  return;
}

Assistant:

static void tc_ap_str_trim_head_from_set (CuTest* tc)
{
	char	buf_str[1024];
	char	buf_set[1024];

	strcpy (buf_set, " \t");

	CuAssertStrEquals_Msg (tc, "strings should be equal", NULL,							ap_str_trim_head_from_set (NULL, NULL));

	strcpy (buf_str, "");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "   a");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "\t\t\ta");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a ",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a ",							ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a  ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a  ",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a   ",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t\t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "a\t\t\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t\t\t",					ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a\t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a\t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " a \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a \t",						ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, " \t \t \ta \t \t \t \t");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "a \t \t \t \t",				ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "         aaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_head_from_set (buf_str, buf_set));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc",				ap_str_trim_head_from_set (buf_str, " \t"));

	strcpy (buf_str, "  \t\t  \t  \taaa bbb ccc \t \t \t   ");
	CuAssertStrEquals_Msg (tc, "strings should be equal", "aaa bbb ccc \t \t \t   ",	ap_str_trim_head_from_set (buf_str, " \t"));
}